

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O3

void __thiscall QSyntaxHighlighter::setDocument(QSyntaxHighlighter *this,QTextDocument *doc)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  QTextLayout *this_00;
  long lVar4;
  char *pcVar5;
  QObject *pQVar6;
  QObject *document;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QObject aQStack_68 [8];
  QTextCursor local_60;
  QTextBlock local_58;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar4 = *(long *)(lVar1 + 0x78);
  if (((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) &&
     (*(QObject **)(lVar1 + 0x80) != (QObject *)0x0)) {
    document = (QObject *)0x0;
    pQVar6 = *(QObject **)(lVar1 + 0x80);
    if (*(int *)(lVar4 + 4) == 0) {
      pQVar6 = document;
    }
    QObject::disconnect(pQVar6,"2contentsChange(int,int,int)",&this->super_QObject,
                        "1_q_reformatBlocks(int,int,int)");
    local_60.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    if (*(long *)(lVar1 + 0x78) != 0) {
      if (*(int *)(*(long *)(lVar1 + 0x78) + 4) == 0) {
        document = (QObject *)0x0;
      }
      else {
        document = *(QObject **)(lVar1 + 0x80);
      }
    }
    QTextCursor::QTextCursor(&local_60,(QTextDocument *)document);
    QTextCursor::beginEditBlock(&local_60);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::begin((QTextDocument *)local_48);
    bVar3 = QTextBlock::isValid((QTextBlock *)local_48);
    if (bVar3) {
      do {
        this_00 = QTextBlock::layout((QTextBlock *)local_48);
        QTextLayout::clearFormats(this_00);
        QTextBlock::next(&local_58);
        local_48._0_8_ = local_58.p;
        local_48._8_4_ = local_58.n;
        bVar3 = QTextBlock::isValid((QTextBlock *)local_48);
      } while (bVar3);
    }
    QTextCursor::endEditBlock(&local_60);
    QTextCursor::~QTextCursor(&local_60);
  }
  if (doc == (QTextDocument *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = QtSharedPointer::ExternalRefCountData::getAndRef(&doc->super_QObject);
  }
  piVar2 = *(int **)(lVar1 + 0x78);
  *(long *)(lVar1 + 0x78) = lVar4;
  *(QTextDocument **)(lVar1 + 0x80) = doc;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
    lVar4 = *(long *)(lVar1 + 0x78);
  }
  if (((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) && (*(char **)(lVar1 + 0x80) != (char *)0x0)) {
    pcVar5 = *(char **)(lVar1 + 0x80);
    if (*(int *)(lVar4 + 4) == 0) {
      pcVar5 = (char *)0x0;
    }
    QObject::connect(aQStack_68,pcVar5,(QObject *)"2contentsChange(int,int,int)",(char *)this,
                     0x6aab15);
    QMetaObject::Connection::~Connection((Connection *)aQStack_68);
    bVar3 = QTextDocument::isEmpty(*(QTextDocument **)(lVar1 + 0x80));
    if (!bVar3) {
      *(undefined1 *)(lVar1 + 0xb0) = 1;
      QTimer::singleShot(0,0,this,"1_q_delayedRehighlight()");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighter::setDocument(QTextDocument *doc)
{
    Q_D(QSyntaxHighlighter);
    if (d->doc) {
        disconnect(d->doc, SIGNAL(contentsChange(int,int,int)),
                   this, SLOT(_q_reformatBlocks(int,int,int)));

        QTextCursor cursor(d->doc);
        cursor.beginEditBlock();
        for (QTextBlock blk = d->doc->begin(); blk.isValid(); blk = blk.next())
            blk.layout()->clearFormats();
        cursor.endEditBlock();
    }
    d->doc = doc;
    if (d->doc) {
        connect(d->doc, SIGNAL(contentsChange(int,int,int)),
                this, SLOT(_q_reformatBlocks(int,int,int)));
        if (!d->doc->isEmpty()) {
            d->rehighlightPending = true;
            QTimer::singleShot(0, this, SLOT(_q_delayedRehighlight()));
        }
    }
}